

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprRefToSrcList(Walker *pWalker,Expr *pExpr)

{
  int *piVar1;
  RefSrcList *pRVar2;
  SrcList *pSVar3;
  ushort uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((pExpr->op != 0xa9) && (pExpr->op != 0xa7)) {
    return 0;
  }
  pRVar2 = (pWalker->u).pRefSrcList;
  pSVar3 = pRVar2->pRef;
  uVar8 = 0;
  if (pSVar3 != (SrcList *)0x0) {
    uVar8 = pSVar3->nSrc;
  }
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  uVar6 = 0;
  do {
    if (uVar9 * 0x68 + 0x68 == uVar6 + 0x68) {
      lVar7 = 0;
      lVar5 = pRVar2->nExclude;
      if (pRVar2->nExclude < 1) {
        lVar5 = lVar7;
      }
      while (lVar5 != lVar7) {
        piVar1 = pRVar2->aiExclude + lVar7;
        lVar7 = lVar7 + 1;
        if (*piVar1 == pExpr->iTable) {
          return 0;
        }
      }
      uVar4 = 2;
      goto LAB_0019d0a4;
    }
    piVar1 = (int *)((long)&pSVar3->a[0].iCursor + uVar6);
    uVar6 = uVar6 + 0x68;
  } while (pExpr->iTable != *piVar1);
  uVar4 = 1;
LAB_0019d0a4:
  pWalker->eCode = pWalker->eCode | uVar4;
  return 0;
}

Assistant:

static int exprRefToSrcList(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   || pExpr->op==TK_AGG_COLUMN
  ){
    int i;
    struct RefSrcList *p = pWalker->u.pRefSrcList;
    SrcList *pSrc = p->pRef;
    int nSrc = pSrc ? pSrc->nSrc : 0;
    for(i=0; i<nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ){
        pWalker->eCode |= 1;
        return WRC_Continue;
      }
    }
    for(i=0; i<p->nExclude && p->aiExclude[i]!=pExpr->iTable; i++){}
    if( i>=p->nExclude ){
      pWalker->eCode |= 2;
    }
  }
  return WRC_Continue;
}